

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaEnc.cpp
# Opt level: O0

SRes crnlib::LzmaEnc_CodeOneBlock
               (CLzmaEnc *p,Bool useLimits,UInt32 maxPackSize,UInt32 maxUnpackSize)

{
  UInt32 UVar1;
  Byte BVar2;
  UInt32 UVar3;
  SRes SVar4;
  int iVar5;
  uint in_ECX;
  uint in_EDX;
  int in_ESI;
  CLzmaEnc *in_RDI;
  UInt32 processed;
  UInt32 posReduced;
  UInt32 base;
  UInt32 footerBits;
  UInt32 i;
  UInt32 posSlot;
  UInt32 distance;
  Byte *data;
  UInt16 *probs;
  Byte curByte_1;
  UInt32 posState;
  UInt32 len;
  UInt32 pos;
  Byte curByte;
  UInt32 numPairs;
  int __result__;
  UInt32 startPos32;
  UInt32 nowPos32;
  CLzmaEnc *in_stack_000001b0;
  UInt32 *in_stack_00000208;
  UInt32 in_stack_00000214;
  CLzmaEnc *in_stack_00000218;
  int in_stack_ffffffffffffff78;
  UInt32 in_stack_ffffffffffffff7c;
  CLzmaEnc *in_stack_ffffffffffffff80;
  CRangeEnc *in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  uint local_58;
  uint local_38;
  uint local_34;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint uVar6;
  uint local_20;
  SRes local_4;
  
  if (in_RDI->inStream != (ISeqInStream *)0x0) {
    (in_RDI->matchFinderBase).stream = in_RDI->inStream;
    (*(in_RDI->matchFinder).Init)(in_RDI->matchFinderObj);
    in_RDI->inStream = (ISeqInStream *)0x0;
  }
  if (in_RDI->finished == 0) {
    local_4 = CheckErrors(in_RDI);
    if (local_4 == 0) {
      local_20 = (uint)in_RDI->nowPos64;
      uVar6 = local_20;
      if (in_RDI->nowPos64 == 0) {
        UVar3 = (*(in_RDI->matchFinder).GetNumAvailableBytes)(in_RDI->matchFinderObj);
        if (UVar3 == 0) {
          SVar4 = Flush(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
          return SVar4;
        }
        ReadMatchDistances((CLzmaEnc *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                           ,(UInt32 *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98))
        ;
        RangeEnc_EncodeBit((CRangeEnc *)
                           CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                           (UInt16 *)in_stack_ffffffffffffff88,
                           (UInt32)((ulong)in_stack_ffffffffffffff80 >> 0x20));
        in_RDI->state = *(UInt32 *)(kLiteralNextStates + (ulong)in_RDI->state * 4);
        BVar2 = (*(in_RDI->matchFinder).GetIndexByte)
                          (in_RDI->matchFinderObj,-in_RDI->additionalOffset);
        in_stack_ffffffffffffffd0 = CONCAT13(BVar2,(int3)in_stack_ffffffffffffffd0);
        LitEnc_Encode((CRangeEnc *)in_stack_ffffffffffffff80,
                      (UInt16 *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0);
        in_RDI->additionalOffset = in_RDI->additionalOffset - 1;
        local_20 = local_20 + 1;
      }
      UVar3 = (*(in_RDI->matchFinder).GetNumAvailableBytes)(in_RDI->matchFinderObj);
      if (UVar3 == 0) {
LAB_0023c559:
        in_RDI->nowPos64 = (ulong)(local_20 - uVar6) + in_RDI->nowPos64;
        local_4 = Flush(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
      }
      else {
        do {
          while( true ) {
            do {
              if (in_RDI->fastMode == 0) {
                local_38 = GetOptimum(in_stack_00000218,in_stack_00000214,in_stack_00000208);
              }
              else {
                local_38 = GetOptimumFast((CLzmaEnc *)CONCAT44(uVar6,local_4),
                                          (UInt32 *)
                                          CONCAT44(in_stack_ffffffffffffffd4,
                                                   in_stack_ffffffffffffffd0));
              }
              UVar3 = (UInt32)((ulong)in_stack_ffffffffffffff80 >> 0x20);
              if ((local_38 == 1) && (local_34 == 0xffffffff)) {
                RangeEnc_EncodeBit((CRangeEnc *)
                                   CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                                   (UInt16 *)in_stack_ffffffffffffff88,UVar3);
                (*(in_RDI->matchFinder).GetPointerToCurrentPos)(in_RDI->matchFinderObj);
                in_stack_ffffffffffffff90 = (local_20 & in_RDI->lpMask) << ((byte)in_RDI->lc & 0x1f)
                ;
                if (in_RDI->state < 7) {
                  LitEnc_Encode((CRangeEnc *)in_stack_ffffffffffffff80,
                                (UInt16 *)
                                CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0);
                }
                else {
                  LitEnc_EncodeMatched
                            ((CRangeEnc *)
                             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                             (UInt16 *)in_stack_ffffffffffffff88,
                             (UInt32)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                             (UInt32)in_stack_ffffffffffffff80);
                }
                in_RDI->state = *(UInt32 *)(kLiteralNextStates + (ulong)in_RDI->state * 4);
              }
              else {
                RangeEnc_EncodeBit((CRangeEnc *)
                                   CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                                   (UInt16 *)in_stack_ffffffffffffff88,UVar3);
                UVar3 = (UInt32)((ulong)in_stack_ffffffffffffff80 >> 0x20);
                if (local_34 < 4) {
                  RangeEnc_EncodeBit((CRangeEnc *)
                                     CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                                     (UInt16 *)in_stack_ffffffffffffff88,UVar3);
                  UVar3 = (UInt32)((ulong)in_stack_ffffffffffffff80 >> 0x20);
                  if (local_34 == 0) {
                    RangeEnc_EncodeBit((CRangeEnc *)
                                       CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)
                                       ,(UInt16 *)in_stack_ffffffffffffff88,UVar3);
                    RangeEnc_EncodeBit((CRangeEnc *)
                                       CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)
                                       ,(UInt16 *)in_stack_ffffffffffffff88,
                                       (UInt32)((ulong)in_stack_ffffffffffffff80 >> 0x20));
                  }
                  else {
                    UVar1 = in_RDI->reps[local_34];
                    RangeEnc_EncodeBit((CRangeEnc *)
                                       CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)
                                       ,(UInt16 *)in_stack_ffffffffffffff88,UVar3);
                    UVar3 = (UInt32)((ulong)in_stack_ffffffffffffff80 >> 0x20);
                    if (local_34 == 1) {
                      RangeEnc_EncodeBit((CRangeEnc *)
                                         CONCAT44(in_stack_ffffffffffffff94,
                                                  in_stack_ffffffffffffff90),
                                         (UInt16 *)in_stack_ffffffffffffff88,UVar3);
                    }
                    else {
                      RangeEnc_EncodeBit((CRangeEnc *)
                                         CONCAT44(in_stack_ffffffffffffff94,
                                                  in_stack_ffffffffffffff90),
                                         (UInt16 *)in_stack_ffffffffffffff88,UVar3);
                      RangeEnc_EncodeBit((CRangeEnc *)
                                         CONCAT44(in_stack_ffffffffffffff94,
                                                  in_stack_ffffffffffffff90),
                                         (UInt16 *)in_stack_ffffffffffffff88,
                                         (UInt32)((ulong)in_stack_ffffffffffffff80 >> 0x20));
                      if (local_34 == 3) {
                        in_RDI->reps[3] = in_RDI->reps[2];
                      }
                      in_RDI->reps[2] = in_RDI->reps[1];
                    }
                    in_RDI->reps[1] = in_RDI->reps[0];
                    in_RDI->reps[0] = UVar1;
                  }
                  if (local_38 == 1) {
                    in_RDI->state = *(UInt32 *)(kShortRepNextStates + (ulong)in_RDI->state * 4);
                  }
                  else {
                    LenEnc_Encode2((CLenPriceEnc *)
                                   CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                                   in_stack_ffffffffffffff88,
                                   (UInt32)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                                   (UInt32)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                                   (UInt32 *)0x23c12d);
                    in_RDI->state = *(UInt32 *)(kRepNextStates + (ulong)in_RDI->state * 4);
                  }
                }
                else {
                  RangeEnc_EncodeBit((CRangeEnc *)
                                     CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                                     (UInt16 *)in_stack_ffffffffffffff88,UVar3);
                  in_RDI->state = *(UInt32 *)(kMatchNextStates + (ulong)in_RDI->state * 4);
                  LenEnc_Encode2((CLenPriceEnc *)
                                 CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                                 in_stack_ffffffffffffff88,
                                 (UInt32)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                                 (UInt32)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                                 (UInt32 *)0x23c1f1);
                  local_34 = local_34 - 4;
                  if (local_34 < 0x80) {
                    local_58 = (uint)in_RDI->g_FastPos[local_34];
                  }
                  else {
                    iVar5 = ((int)(0x7ffff - local_34) >> 0x1f & 0xcU) + 6;
                    local_58 = (uint)in_RDI->g_FastPos[local_34 >> (sbyte)iVar5] + iVar5 * 2;
                  }
                  in_stack_ffffffffffffff80 = (CLzmaEnc *)&in_RDI->rc;
                  in_stack_ffffffffffffff88 = (CRangeEnc *)in_RDI->posSlotEncoder;
                  if (local_38 < 5) {
                    in_stack_ffffffffffffff7c = local_38 - 2;
                  }
                  else {
                    in_stack_ffffffffffffff7c = 3;
                  }
                  RcTree_Encode((CRangeEnc *)
                                CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                                (UInt16 *)in_stack_ffffffffffffff88,
                                (int)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                                (UInt32)in_stack_ffffffffffffff80);
                  if (3 < local_58) {
                    if (local_58 < 0xe) {
                      RcTree_ReverseEncode
                                ((CRangeEnc *)
                                 CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                                 (UInt16 *)in_stack_ffffffffffffff88,
                                 (int)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                                 (UInt32)in_stack_ffffffffffffff80);
                    }
                    else {
                      RangeEnc_EncodeDirectBits
                                ((CRangeEnc *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                                 in_stack_ffffffffffffff78);
                      RcTree_ReverseEncode
                                ((CRangeEnc *)
                                 CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                                 (UInt16 *)in_stack_ffffffffffffff88,
                                 (int)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                                 (UInt32)in_stack_ffffffffffffff80);
                      in_RDI->alignPriceCount = in_RDI->alignPriceCount + 1;
                    }
                  }
                  in_RDI->reps[3] = in_RDI->reps[2];
                  in_RDI->reps[2] = in_RDI->reps[1];
                  in_RDI->reps[1] = in_RDI->reps[0];
                  in_RDI->reps[0] = local_34;
                  in_RDI->matchPriceCount = in_RDI->matchPriceCount + 1;
                }
              }
              in_RDI->additionalOffset = in_RDI->additionalOffset - local_38;
              local_20 = local_38 + local_20;
            } while (in_RDI->additionalOffset != 0);
            if (in_RDI->fastMode == 0) {
              if (0x7f < in_RDI->matchPriceCount) {
                FillDistancesPrices(in_stack_000001b0);
              }
              if (0xf < in_RDI->alignPriceCount) {
                FillAlignPrices(in_stack_ffffffffffffff80);
              }
            }
            UVar3 = (*(in_RDI->matchFinder).GetNumAvailableBytes)(in_RDI->matchFinderObj);
            if (UVar3 == 0) goto LAB_0023c559;
            in_stack_ffffffffffffff94 = local_20 - uVar6;
            if (in_ESI == 0) break;
            if ((in_ECX <= in_stack_ffffffffffffff94 + 0x112c) ||
               ((Byte *)(ulong)in_EDX <=
                (in_RDI->rc).buf +
                (in_RDI->rc).cacheSize + ((in_RDI->rc).processed - (long)(in_RDI->rc).bufBase) +
                0x2000)) goto LAB_0023c559;
          }
        } while (in_stack_ffffffffffffff94 < 0x8000);
        in_RDI->nowPos64 = (ulong)(local_20 - uVar6) + in_RDI->nowPos64;
        local_4 = CheckErrors(in_RDI);
      }
    }
  }
  else {
    local_4 = in_RDI->result;
  }
  return local_4;
}

Assistant:

static SRes LzmaEnc_CodeOneBlock(CLzmaEnc* p, Bool useLimits, UInt32 maxPackSize, UInt32 maxUnpackSize) {
  UInt32 nowPos32, startPos32;
  if (p->inStream != 0) {
    p->matchFinderBase.stream = p->inStream;
    p->matchFinder.Init(p->matchFinderObj);
    p->inStream = 0;
  }

  if (p->finished)
    return p->result;
  RINOK(CheckErrors(p));

  nowPos32 = (UInt32)p->nowPos64;
  startPos32 = nowPos32;

  if (p->nowPos64 == 0) {
    UInt32 numPairs;
    Byte curByte;
    if (p->matchFinder.GetNumAvailableBytes(p->matchFinderObj) == 0)
      return Flush(p, nowPos32);
    ReadMatchDistances(p, &numPairs);
    RangeEnc_EncodeBit(&p->rc, &p->isMatch[p->state][0], 0);
    p->state = kLiteralNextStates[p->state];
    curByte = p->matchFinder.GetIndexByte(p->matchFinderObj, 0 - p->additionalOffset);
    LitEnc_Encode(&p->rc, p->litProbs, curByte);
    p->additionalOffset--;
    nowPos32++;
  }

  if (p->matchFinder.GetNumAvailableBytes(p->matchFinderObj) != 0)
    for (;;) {
      UInt32 pos, len, posState;

      if (p->fastMode)
        len = GetOptimumFast(p, &pos);
      else
        len = GetOptimum(p, nowPos32, &pos);

#ifdef SHOW_STAT2
      printf("\n pos = %4X,   len = %d   pos = %d", nowPos32, len, pos);
#endif

      posState = nowPos32 & p->pbMask;
      if (len == 1 && pos == (UInt32)-1) {
        Byte curByte;
        CLzmaProb* probs;
        const Byte* data;

        RangeEnc_EncodeBit(&p->rc, &p->isMatch[p->state][posState], 0);
        data = p->matchFinder.GetPointerToCurrentPos(p->matchFinderObj) - p->additionalOffset;
        curByte = *data;
        probs = LIT_PROBS(nowPos32, *(data - 1));
        if (IsCharState(p->state))
          LitEnc_Encode(&p->rc, probs, curByte);
        else
          LitEnc_EncodeMatched(&p->rc, probs, curByte, *(data - p->reps[0] - 1));
        p->state = kLiteralNextStates[p->state];
      } else {
        RangeEnc_EncodeBit(&p->rc, &p->isMatch[p->state][posState], 1);
        if (pos < LZMA_NUM_REPS) {
          RangeEnc_EncodeBit(&p->rc, &p->isRep[p->state], 1);
          if (pos == 0) {
            RangeEnc_EncodeBit(&p->rc, &p->isRepG0[p->state], 0);
            RangeEnc_EncodeBit(&p->rc, &p->isRep0Long[p->state][posState], ((len == 1) ? 0 : 1));
          } else {
            UInt32 distance = p->reps[pos];
            RangeEnc_EncodeBit(&p->rc, &p->isRepG0[p->state], 1);
            if (pos == 1)
              RangeEnc_EncodeBit(&p->rc, &p->isRepG1[p->state], 0);
            else {
              RangeEnc_EncodeBit(&p->rc, &p->isRepG1[p->state], 1);
              RangeEnc_EncodeBit(&p->rc, &p->isRepG2[p->state], pos - 2);
              if (pos == 3)
                p->reps[3] = p->reps[2];
              p->reps[2] = p->reps[1];
            }
            p->reps[1] = p->reps[0];
            p->reps[0] = distance;
          }
          if (len == 1)
            p->state = kShortRepNextStates[p->state];
          else {
            LenEnc_Encode2(&p->repLenEnc, &p->rc, len - LZMA_MATCH_LEN_MIN, posState, !p->fastMode, p->ProbPrices);
            p->state = kRepNextStates[p->state];
          }
        } else {
          UInt32 posSlot;
          RangeEnc_EncodeBit(&p->rc, &p->isRep[p->state], 0);
          p->state = kMatchNextStates[p->state];
          LenEnc_Encode2(&p->lenEnc, &p->rc, len - LZMA_MATCH_LEN_MIN, posState, !p->fastMode, p->ProbPrices);
          pos -= LZMA_NUM_REPS;
          GetPosSlot(pos, posSlot);
          RcTree_Encode(&p->rc, p->posSlotEncoder[GetLenToPosState(len)], kNumPosSlotBits, posSlot);

          if (posSlot >= kStartPosModelIndex) {
            UInt32 footerBits = ((posSlot >> 1) - 1);
            UInt32 base = ((2 | (posSlot & 1)) << footerBits);
            UInt32 posReduced = pos - base;

            if (posSlot < kEndPosModelIndex)
              RcTree_ReverseEncode(&p->rc, p->posEncoders + base - posSlot - 1, footerBits, posReduced);
            else {
              RangeEnc_EncodeDirectBits(&p->rc, posReduced >> kNumAlignBits, footerBits - kNumAlignBits);
              RcTree_ReverseEncode(&p->rc, p->posAlignEncoder, kNumAlignBits, posReduced & kAlignMask);
              p->alignPriceCount++;
            }
          }
          p->reps[3] = p->reps[2];
          p->reps[2] = p->reps[1];
          p->reps[1] = p->reps[0];
          p->reps[0] = pos;
          p->matchPriceCount++;
        }
      }
      p->additionalOffset -= len;
      nowPos32 += len;
      if (p->additionalOffset == 0) {
        UInt32 processed;
        if (!p->fastMode) {
          if (p->matchPriceCount >= (1 << 7))
            FillDistancesPrices(p);
          if (p->alignPriceCount >= kAlignTableSize)
            FillAlignPrices(p);
        }
        if (p->matchFinder.GetNumAvailableBytes(p->matchFinderObj) == 0)
          break;
        processed = nowPos32 - startPos32;
        if (useLimits) {
          if (processed + kNumOpts + 300 >= maxUnpackSize ||
              RangeEnc_GetProcessed(&p->rc) + kNumOpts * 2 >= maxPackSize)
            break;
        } else if (processed >= (1 << 15)) {
          p->nowPos64 += nowPos32 - startPos32;
          return CheckErrors(p);
        }
      }
    }
  p->nowPos64 += nowPos32 - startPos32;
  return Flush(p, nowPos32);
}